

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

Integer * copy_map64(int64_t *block,int block_ndim,int64_t *map)

{
  long lVar1;
  ulong uVar2;
  Integer *pIVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  uVar2 = 0;
  uVar8 = (ulong)(uint)block_ndim;
  if (block_ndim < 1) {
    uVar8 = uVar2;
  }
  lVar7 = 0;
  for (; uVar8 != uVar2; uVar2 = uVar2 + 1) {
    lVar7 = lVar7 + block[uVar2];
  }
  pIVar3 = (Integer *)malloc(lVar7 * 8);
  lVar4 = 0;
  for (uVar2 = 0; uVar2 != uVar8; uVar2 = uVar2 + 1) {
    lVar1 = block[uVar2];
    lVar7 = lVar7 - lVar1;
    lVar5 = 0;
    if (0 < lVar1) {
      lVar5 = lVar1;
    }
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
      pIVar3[lVar7 + lVar6] = map[lVar4 + lVar6] + 1;
    }
    lVar4 = lVar4 + lVar1;
  }
  return pIVar3;
}

Assistant:

static Integer* copy_map64(int64_t block[], int block_ndim, int64_t map[])
{
    int d;
    int64_t i,sum=0,capi_offset=0,map_offset=0;
    Integer *_ga_map_capi;

    for (d=0; d<block_ndim; d++) {
        sum += block[d];
    }

    _ga_map_capi = (Integer*)malloc(sum * sizeof(Integer));

    capi_offset = sum;
    for (d=0; d<block_ndim; d++) {
        capi_offset -= block[d];
        for (i=0; i<block[d]; i++) {
            _ga_map_capi[capi_offset+i] = map[map_offset+i] + 1;
        }
        map_offset += block[d];
    }

    return _ga_map_capi;
}